

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  PathTest *this;
  int local_44;
  undefined1 local_40 [4];
  int i;
  TestSuite ts;
  TestRunner runner;
  char **argv_local;
  int argc_local;
  
  TestRunner::TestRunner((TestRunner *)&ts.mTestCases.field_0x17,*argv);
  TestSuite::TestSuite((TestSuite *)local_40);
  for (local_44 = 0; local_44 < 9; local_44 = local_44 + 1) {
    this = (PathTest *)
           operator_new(0x128,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                        ,0x174);
    PathTest::PathTest(this,local_44 + 1);
    TestSuite::AddTestCase((TestSuite *)local_40,(TestCase *)this);
  }
  TestRunner::RunAll((TestRunner *)&ts.mTestCases.field_0x17,(TestSuite *)local_40);
  TestSuite::~TestSuite((TestSuite *)local_40);
  return 0;
}

Assistant:

int main( int argc, char* argv[] )
{
	TestRunner runner( argv[ 0 ] );
	TestSuite ts;
	
	for ( int i = 0; i < PathTest::gNumberOfTests; i++ )
	{
		ts.AddTestCase( jh_new PathTest( i + 1 ) );
	}
	
	runner.RunAll( ts );
	
	return 0;
}